

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedDatum.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::FixedDatum::GetDatumValue(FixedDatum *this,KOCTET *Buffer,KUINT16 BufferSize)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  KOCTET *pKStack_18;
  KUINT16 BufferSize_local;
  KOCTET *Buffer_local;
  FixedDatum *this_local;
  
  if (BufferSize < 4) {
    local_1a = BufferSize;
    pKStack_18 = Buffer;
    Buffer_local = (KOCTET *)this;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GetDatumValue",&local_41);
    KException::KException(this_00,&local_40,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  *(undefined4 *)Buffer = *(undefined4 *)this->m_cDatumValue;
  return;
}

Assistant:

void FixedDatum::GetDatumValue(KOCTET *Buffer, KUINT16 BufferSize) const noexcept(false)
{
    if( BufferSize < 4 )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );
	memcpy( Buffer, m_cDatumValue, 4 );
}